

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O0

char * __thiscall Memory::JitArenaAllocator::AllocZero(JitArenaAllocator *this,size_t nbytes)

{
  char *pcVar1;
  size_t nbytes_local;
  JitArenaAllocator *this_local;
  
  pcVar1 = ArenaAllocator::AllocZero(&this->super_ArenaAllocator,nbytes);
  return pcVar1;
}

Assistant:

char * AllocZero(DECLSPEC_GUARD_OVERFLOW size_t nbytes)
    {
        return ArenaAllocator::AllocZero(nbytes);
    }